

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_factory.h
# Opt level: O0

bool __thiscall ClassFactory::Register<A>(ClassFactory *this,string *name)

{
  pair<std::__detail::_Node_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::type_index>,_std::function<void_*(std::any)>_>,_false,_false>,_bool>
  pVar1;
  anon_class_1_0_00000001 local_51;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::type_index>
  local_50;
  _Node_iterator_base<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::type_index>,_std::function<void_*(std::any)>_>,_false>
  local_28;
  byte local_20;
  string *local_18;
  string *name_local;
  ClassFactory *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::type_index>
  ::pair<const_std::type_info_&,_true>(&local_50,name,(type_info *)&std::tuple<>::typeinfo);
  pVar1 = std::
          unordered_map<std::pair<std::__cxx11::string,std::type_index>,std::function<void*(std::any)>,std::hash<std::pair<std::__cxx11::string,std::type_index>>,std::equal_to<std::pair<std::__cxx11::string,std::type_index>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::type_index>const,std::function<void*(std::any)>>>>
          ::
          try_emplace<ClassFactory::Register<A>(std::__cxx11::string_const&)::_lambda(std::any)_1_>
                    ((unordered_map<std::pair<std::__cxx11::string,std::type_index>,std::function<void*(std::any)>,std::hash<std::pair<std::__cxx11::string,std::type_index>>,std::equal_to<std::pair<std::__cxx11::string,std::type_index>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::type_index>const,std::function<void*(std::any)>>>>
                      *)this,&local_50,&local_51);
  local_28._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::type_index>,_std::function<void_*(std::any)>_>,_false>
       ._M_cur;
  local_20 = pVar1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::type_index>
  ::~pair(&local_50);
  return (bool)(pVar1.second & 1);
}

Assistant:

bool Register(const std::string& name) {
        return creators_.try_emplace(
            { name, typeid(std::tuple<Args...>) },
            [](std::any arg) {
                return reinterpret_cast<void *>(
                    std::apply(ClassFactory::ApplyObject<T, Args...>,
                        std::any_cast<std::tuple<Args...>>(arg)));
            }
        ).second;
    }